

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_SLL(void)

{
  bool bVar1;
  Z80Reg ZVar2;
  ulong uVar3;
  int aiStack_28 [2];
  int e [6];
  Z80Reg reg;
  
  do {
    aiStack_28[0] = -1;
    aiStack_28[1] = -1;
    e[0] = -1;
    e[1] = -1;
    e[2] = -1;
    e[3] = -1;
    e[5] = OpCode_CbFamily(0x30,aiStack_28,true);
    if (((e[5] != Z80_A) && (((e[5] == Z80_BC || (e[5] == Z80_DE)) || (e[5] == Z80_HL)))) &&
       (bVar1 = Options::noFakes(true), !bVar1)) {
      e[0] = -2;
      e[1] = 0xcb;
      aiStack_28[0] = 0xcb;
      ZVar2 = GetRegister_r16Low(e[5]);
      aiStack_28[1] = ZVar2 + Z80_HL;
      ZVar2 = GetRegister_r16High(e[5]);
      e[2] = ZVar2 + Z80_BC;
    }
    EmitBytes(aiStack_28,true);
    uVar3 = (*DAT_001e16b0)(&::lp);
  } while ((uVar3 & 1) != 0);
  return;
}

Assistant:

static void OpCode_SLL() {
		Z80Reg reg;
		do {
			int e[] { -1, -1, -1, -1, -1, -1 };
			switch (reg = OpCode_CbFamily(0x30, e)) {
			case Z80_A:		break;			// fully processed by the helper function
			case Z80_BC:	case Z80_DE:	case Z80_HL:
				if (Options::noFakes()) break;
				e[2] = INSTRUCTION_START_MARKER;
				e[0] = e[3] = 0xcb;
				e[1] = 0x30 + GetRegister_r16Low(reg);
				e[4] = 0x10 + GetRegister_r16High(reg);
				break;
			default:		break;
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}